

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QByteArray * qStringAsUcs2Le(QByteArray *__return_storage_ptr__,QString *src)

{
  Data *pDVar1;
  char16_t *pcVar2;
  char *pcVar3;
  QByteArray *pQVar4;
  QByteArray *pQVar5;
  QString *__range1;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(src->d).size * 2,'\0');
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  pQVar4 = (QByteArray *)(src->d).size;
  if (pQVar4 != (QByteArray *)0x0) {
    pcVar2 = (src->d).ptr;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    pQVar4 = (QByteArray *)((long)pQVar4 * 2);
    pQVar5 = (QByteArray *)0x0;
    do {
      *(undefined2 *)(pcVar3 + (long)pQVar5) = *(undefined2 *)((long)pcVar2 + (long)pQVar5);
      pQVar5 = (QByteArray *)((long)&(pQVar5->d).d + 2);
    } while (pQVar4 != pQVar5);
  }
  return pQVar4;
}

Assistant:

static QByteArray qStringAsUcs2Le(const QString& src)
{
    QByteArray rc(2*src.size(), 0);
    unsigned short *d = (unsigned short*)rc.data();
    for (QChar ch : src)
        *d++ = qToLittleEndian(quint16(ch.unicode()));

    return rc;
}